

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerType.cpp
# Opt level: O3

void __thiscall hdc::PointerType::~PointerType(PointerType *this)

{
  ~PointerType(this);
  operator_delete(this);
  return;
}

Assistant:

PointerType::~PointerType() {
    if (subtype != nullptr) {
        delete subtype;
    }
}